

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

int __thiscall dgrminer::PartialUnion::getLabelEncoding(PartialUnion *this,string *label)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *label_local;
  PartialUnion *this_local;
  
  it._M_node = (_Base_ptr)label;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->labelEncoding,label);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->labelEncoding);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_28);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    this->number_of_labels = this->number_of_labels + 1;
    std::make_pair<std::__cxx11::string&,int&>(&local_58,label,&this->number_of_labels);
    std::
    map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::insert<std::pair<std::__cxx11::string,int>>
              ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->labelEncoding,&local_58);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_58);
    this_local._4_4_ = this->number_of_labels;
  }
  return this_local._4_4_;
}

Assistant:

int PartialUnion::getLabelEncoding(string label)
	{
		auto it = labelEncoding.find(label);
		if (it != labelEncoding.end()) {
			return it->second;
		}
		else {
			(number_of_labels)++;
			labelEncoding.insert(std::make_pair(label, number_of_labels));
			return number_of_labels;
		}
	}